

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,hex_writer f)

{
  ulong uVar1;
  alignment aVar2;
  int iVar3;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
  f_00;
  ulong uVar4;
  ulong size;
  align_spec as;
  align_spec local_48;
  char *local_38;
  size_t sStack_30;
  undefined1 local_28;
  undefined7 uStack_27;
  long lStack_20;
  int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *local_18;
  uint uStack_10;
  undefined4 uStack_c;
  
  sStack_30 = prefix.size_;
  local_38 = prefix.data_;
  uVar1 = num_digits + sStack_30;
  local_28 = (undefined1)(spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_NUMERIC) {
    uVar4 = (ulong)(spec->super_align_spec).width_;
    size = uVar4;
    if (uVar4 < uVar1) {
      size = uVar1;
    }
    lStack_20 = 0;
    if (uVar1 <= uVar4) {
      lStack_20 = uVar4 - uVar1;
    }
  }
  else {
    iVar3 = spec->precision_;
    if ((int)num_digits < iVar3) {
      local_28 = 0x30;
      size = (long)iVar3 + sStack_30;
      lStack_20 = (long)iVar3 - (ulong)num_digits;
    }
    else {
      size = uVar1;
      lStack_20 = 0;
    }
  }
  local_48.align_ = (spec->super_align_spec).align_;
  local_48.width_ = (spec->super_align_spec).width_;
  local_48.fill_ = (spec->super_align_spec).fill_;
  if (aVar2 == ALIGN_DEFAULT) {
    local_48.align_ = ALIGN_RIGHT;
  }
  local_18 = f.self;
  uStack_10 = f.num_digits;
  f_00._17_7_ = uStack_27;
  f_00.fill = local_28;
  f_00.f._12_4_ = uStack_c;
  f_00.f.num_digits = f.num_digits;
  f_00.prefix = prefix;
  f_00.padding = lStack_20;
  f_00.f.self = f.self;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>>
            (this,size,&local_48,f_00);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }